

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::disableDISTANCEheuristic(Solver *this)

{
  int local_14;
  
  if (this->current_heuristic == DISTANCE) {
    this->current_heuristic = CHB;
    vec<int>::growTo(&(this->order_heap_CHB).indices,(this->order_heap_DISTANCE).indices.sz,
                     &local_14);
    Heap<Minisat::Solver::VarOrderLt>::build
              (&this->order_heap_CHB,&(this->order_heap_DISTANCE).heap);
    this->order_heap = &this->order_heap_CHB;
  }
  else if (this->current_heuristic == VSIDS_DISTANCE) {
    this->current_heuristic = VSIDS_CHB;
  }
  return;
}

Assistant:

void Solver::disableDISTANCEheuristic()
{
    switch (current_heuristic) {
    case VSIDS_DISTANCE:
        /* currently VSIDS, just change swap partner */
        current_heuristic = VSIDS_CHB;
        break;
    case DISTANCE:
        current_heuristic = CHB;
        order_heap_CHB.growTo(order_heap_DISTANCE);
        order_heap_CHB.build(order_heap_DISTANCE.elements());
        order_heap = &order_heap_CHB;
        break;
    default:
        break;
    }
    assert(!considersDISTANCE() && "we should have disabled DISTANCE heuristic");
    assert((trail.size() + order_heap->size()) >= full_heap_size);
}